

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midimixup.cpp
# Opt level: O2

void swapNotes(vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *notes,int index1,
              int index2)

{
  pointer ppMVar1;
  MidiEvent *this;
  MidiEvent *this_00;
  uint value;
  uint value_00;
  MidiEvent *this_01;
  MidiEvent *this_02;
  
  ppMVar1 = (notes->super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>)._M_impl
            .super__Vector_impl_data._M_start;
  this = ppMVar1[index1];
  this_00 = ppMVar1[index2];
  this_01 = smf::MidiEvent::getLinkedEvent(this);
  this_02 = smf::MidiEvent::getLinkedEvent
                      ((notes->
                       super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>).
                       _M_impl.super__Vector_impl_data._M_start[index2]);
  if (this_02 != (MidiEvent *)0x0 && (this_01 != (MidiEvent *)0x0 && this_00 != (MidiEvent *)0x0)) {
    value = smf::MidiMessage::getKeyNumber(&this->super_MidiMessage);
    value_00 = smf::MidiMessage::getKeyNumber(&this_00->super_MidiMessage);
    if (-1 < (int)(value_00 | value) && value != value_00) {
      smf::MidiMessage::setKeyNumber(&this->super_MidiMessage,value_00);
      smf::MidiMessage::setKeyNumber(&this_01->super_MidiMessage,value_00);
      smf::MidiMessage::setKeyNumber(&this_00->super_MidiMessage,value);
      smf::MidiMessage::setKeyNumber(&this_02->super_MidiMessage,value);
      return;
    }
  }
  return;
}

Assistant:

void swapNotes(vector<MidiEvent*>& notes, int index1, int index2) {
   MidiEvent* noteon1  = notes[index1];
   MidiEvent* noteon2  = notes[index2];
   MidiEvent* noteoff1 = notes[index1]->getLinkedEvent();
   MidiEvent* noteoff2 = notes[index2]->getLinkedEvent();
   if (noteon1  == NULL) { return; }
   if (noteon2  == NULL) { return; }
   if (noteoff1 == NULL) { return; }
   if (noteoff2 == NULL) { return; }
   int pitch1 = noteon1->getKeyNumber();
   int pitch2 = noteon2->getKeyNumber();
   if (pitch1 == pitch2) { return; }
   if (pitch1 < 0) { return; }
   if (pitch2 < 0) { return; }

   noteon1->setKeyNumber(pitch2);
   noteoff1->setKeyNumber(pitch2);
   noteon2->setKeyNumber(pitch1);
   noteoff2->setKeyNumber(pitch1);
}